

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::PyiGenerator::PrintMessage
          (PyiGenerator *this,Descriptor *message_descriptor,bool is_nested)

{
  Printer *pPVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CppType CVar6;
  AlphaNum *pAVar7;
  EnumDescriptor *pEVar8;
  Descriptor *pDVar9;
  FieldDescriptor *pFVar10;
  FieldDescriptor *pFVar11;
  char *pcVar12;
  char *pcVar13;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view sVar14;
  string_view s;
  string_view local_718;
  string_view local_708;
  string_view local_6f8;
  string_view local_6e8;
  string_view local_6d8;
  string local_6c8;
  string_view local_6a8;
  string local_698;
  string_view local_678;
  string local_668;
  string_view local_648;
  string local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_618;
  string *extra_init_types;
  string local_600;
  string local_5e0;
  string_view local_5c0;
  Descriptor *local_5b0;
  Descriptor *map_entry;
  allocator<char> local_591;
  string local_590;
  string_view local_570;
  allocator<char> local_559;
  string_view local_558;
  undefined1 local_548 [8];
  string field_name;
  FieldDescriptor *field_des_3;
  int i_5;
  bool has_python_keywords;
  allocator<char> local_4e1;
  string local_4e0 [8];
  string self_arg_name;
  allocator<char> local_4a9;
  string local_4a8;
  string_view local_488;
  string_view local_478;
  AlphaNum local_468;
  string local_438;
  string local_418;
  AlphaNum local_3f8;
  AlphaNum local_3c8;
  string local_398;
  AlphaNum local_378;
  AlphaNum local_348;
  string local_318;
  FieldDescriptor *local_2f8;
  FieldDescriptor *value_des;
  FieldDescriptor *key_des;
  undefined1 local_2e0 [8];
  string field_type;
  FieldDescriptor *field_des_2;
  undefined1 local_2a0 [4];
  int i_4;
  AlphaNum *local_270;
  char *local_268;
  string local_260;
  AlphaNum local_240;
  string local_210;
  string_view local_1f0;
  FieldDescriptor *local_1e0;
  FieldDescriptor *field_des_1;
  int local_1d0;
  int i_3;
  int i_2;
  int i_1;
  string_view local_1b8;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  FieldDescriptor *local_168;
  FieldDescriptor *field_des;
  int i;
  int items_printed;
  allocator<char> local_141;
  string local_140;
  string_view local_120;
  AlphaNum *local_110;
  char *local_108;
  AlphaNum local_100;
  AlphaNum local_d0;
  string local_a0;
  string_view local_70;
  undefined1 local_60 [8];
  string extra_base;
  string_view class_name;
  bool is_nested_local;
  Descriptor *message_descriptor_local;
  PyiGenerator *this_local;
  
  if (!is_nested) {
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&class_name._M_str,"\n");
    io::Printer::Print<>(pPVar1,stack0xffffffffffffffd0);
  }
  join_0x00000010_0x00000000_ = Descriptor::name(message_descriptor);
  std::__cxx11::string::string((string *)local_60);
  local_70 = Descriptor::full_name(message_descriptor);
  sVar14._M_str = local_70._M_str;
  sVar14._M_len = (size_t)sVar14._M_str;
  bVar2 = IsWellKnownType((python *)local_70._M_len,sVar14);
  if (bVar2) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,", _well_known_types.");
    sVar14 = Descriptor::name(message_descriptor);
    local_108 = sVar14._M_str;
    pAVar7 = (AlphaNum *)sVar14._M_len;
    local_110 = pAVar7;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_100,sVar14);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_a0,(lts_20250127 *)&local_d0,&local_100,pAVar7);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    std::__cxx11::string::operator=((string *)local_60,"");
  }
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_120,"class $class_name$(_message.Message$extra_base$):\n");
  pcVar13 = "extra_base";
  io::Printer::
  Print<char[11],std::basic_string_view<char,std::char_traits<char>>,char[11],std::__cxx11::string>
            (pPVar1,local_120,(char (*) [11])0xb1d2bf,
             (basic_string_view<char,_std::char_traits<char>_> *)((long)&extra_base.field_2 + 8),
             (char (*) [11])"extra_base",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"class_name",&local_141);
  Annotate<google::protobuf::Descriptor>(this,&local_140,message_descriptor);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  io::Printer::Indent(this->printer_);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&i,"__slots__ = (");
  io::Printer::Print<>(pPVar1,_i);
  field_des._4_4_ = 0;
  field_des._0_4_ = 0;
  while( true ) {
    iVar5 = (int)field_des;
    iVar4 = Descriptor::field_count(message_descriptor);
    if (iVar4 <= iVar5) break;
    local_168 = Descriptor::field(message_descriptor,(int)field_des);
    sVar14 = FieldDescriptor::name(local_168);
    name._M_str = sVar14._M_str;
    name._M_len = (size_t)name._M_str;
    local_178 = sVar14;
    bVar2 = IsPythonKeyword((python *)sVar14._M_len,name);
    if (!bVar2) {
      if (0 < field_des._4_4_) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,", ");
        io::Printer::Print<>(pPVar1,local_188);
      }
      field_des._4_4_ = field_des._4_4_ + 1;
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_198,"\"$field_name$\"");
      sVar14 = FieldDescriptor::name(local_168);
      local_1a8 = sVar14;
      io::Printer::Print<char[11],std::basic_string_view<char,std::char_traits<char>>>
                (pPVar1,local_198,(char (*) [11])0xaa5115,&local_1a8);
    }
    field_des._0_4_ = (int)field_des + 1;
  }
  pPVar1 = this->printer_;
  pcVar12 = ")\n";
  if (field_des._4_4_ == 1) {
    pcVar12 = ",)\n";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,pcVar12);
  io::Printer::Print<>(pPVar1,local_1b8);
  iVar5 = Descriptor::extension_range_count(message_descriptor);
  if (0 < iVar5) {
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&i_2,
               "Extensions: _python_message._ExtensionDict\n");
    io::Printer::Print<>(pPVar1,_i_2);
  }
  i_3 = 0;
  while( true ) {
    iVar5 = i_3;
    iVar4 = Descriptor::enum_type_count(message_descriptor);
    if (iVar4 <= iVar5) break;
    pEVar8 = Descriptor::enum_type(message_descriptor,i_3);
    PrintEnum(this,pEVar8);
    pEVar8 = Descriptor::enum_type(message_descriptor,i_3);
    PrintEnumValues(this,pEVar8,false);
    i_3 = i_3 + 1;
  }
  local_1d0 = 0;
  while( true ) {
    iVar5 = local_1d0;
    iVar4 = Descriptor::nested_type_count(message_descriptor);
    if (iVar4 <= iVar5) break;
    pDVar9 = Descriptor::nested_type(message_descriptor,local_1d0);
    PrintMessage(this,pDVar9,true);
    local_1d0 = local_1d0 + 1;
  }
  PrintExtensions<google::protobuf::Descriptor>(this,message_descriptor);
  field_des_1._4_4_ = 0;
  while( true ) {
    iVar5 = field_des_1._4_4_;
    iVar4 = Descriptor::field_count(message_descriptor);
    if (iVar4 <= iVar5) break;
    local_1e0 = Descriptor::field(message_descriptor,field_des_1._4_4_);
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f0,"$field_number_name$: _ClassVar[int]\n");
    sVar14 = FieldDescriptor::name(local_1e0);
    s._M_len = sVar14._M_str;
    pAVar7 = (AlphaNum *)sVar14._M_len;
    s._M_str = (char *)pAVar7;
    local_270 = pAVar7;
    local_268 = s._M_len;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_260,(lts_20250127 *)pAVar7,s);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_240,&local_260);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_2a0,"_FIELD_NUMBER");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_210,(lts_20250127 *)&local_240,(AlphaNum *)local_2a0,pAVar7);
    io::Printer::Print<char[18],std::__cxx11::string>
              (pPVar1,local_1f0,(char (*) [18])"field_number_name",&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_260);
    field_des_1._4_4_ = field_des_1._4_4_ + 1;
  }
  field_des_2._4_4_ = 0;
  while( true ) {
    iVar5 = Descriptor::field_count(message_descriptor);
    if (iVar5 <= field_des_2._4_4_) break;
    pFVar10 = Descriptor::field(message_descriptor,field_des_2._4_4_);
    sVar14 = FieldDescriptor::name(pFVar10);
    name_00._M_str = sVar14._M_str;
    field_type.field_2._8_8_ = sVar14._M_len;
    name_00._M_len = (size_t)name_00._M_str;
    bVar2 = IsPythonKeyword((python *)field_type.field_2._8_8_,name_00);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2e0,"",(allocator<char> *)((long)&key_des + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&key_des + 7));
      bVar2 = FieldDescriptor::is_map(pFVar10);
      if (bVar2) {
        pDVar9 = FieldDescriptor::message_type(pFVar10);
        value_des = Descriptor::field(pDVar9,0);
        pDVar9 = FieldDescriptor::message_type(pFVar10);
        local_2f8 = Descriptor::field(pDVar9,1);
        CVar6 = FieldDescriptor::cpp_type(local_2f8);
        pcVar12 = "_containers.ScalarMap[";
        if (CVar6 == CPPTYPE_MESSAGE) {
          pcVar12 = "_containers.MessageMap[";
        }
        absl::lts_20250127::AlphaNum::AlphaNum(&local_348,pcVar12);
        GetFieldType_abi_cxx11_(&local_398,this,value_des,message_descriptor);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_378,&local_398);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_3c8,", ");
        GetFieldType_abi_cxx11_(&local_418,this,local_2f8,message_descriptor);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_3f8,&local_418);
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_318,(lts_20250127 *)&local_348,&local_378,&local_3c8,&local_3f8,
                   (AlphaNum *)pcVar13);
        std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_398);
      }
      else {
        bVar2 = FieldDescriptor::is_repeated(pFVar10);
        if (bVar2) {
          CVar6 = FieldDescriptor::cpp_type(pFVar10);
          pcVar13 = "_containers.RepeatedScalarFieldContainer[";
          if (CVar6 == CPPTYPE_MESSAGE) {
            pcVar13 = "_containers.RepeatedCompositeFieldContainer[";
          }
          std::__cxx11::string::operator=((string *)local_2e0,pcVar13);
        }
        GetFieldType_abi_cxx11_(&local_438,this,pFVar10,message_descriptor);
        std::__cxx11::string::operator+=((string *)local_2e0,(string *)&local_438);
        std::__cxx11::string::~string((string *)&local_438);
      }
      bVar2 = FieldDescriptor::is_repeated(pFVar10);
      if (bVar2) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_468,"]");
        absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_2e0,&local_468);
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_478,"$name$: $type$\n");
      sVar14 = FieldDescriptor::name(pFVar10);
      pcVar13 = "type";
      local_488 = sVar14;
      io::Printer::
      Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
                (pPVar1,local_478,(char (*) [5])0xc259cc,&local_488,(char (*) [5])0xbe040e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"name",&local_4a9);
      Annotate<google::protobuf::FieldDescriptor>(this,&local_4a8,pFVar10);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator(&local_4a9);
      std::__cxx11::string::~string((string *)local_2e0);
    }
    field_des_2._4_4_ = field_des_2._4_4_ + 1;
  }
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&self_arg_name.field_2 + 8),
             "def __init__(");
  io::Printer::Print<>(pPVar1,stack0xfffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"self",&local_4e1);
  std::allocator<char>::~allocator(&local_4e1);
  while( true ) {
    sVar14 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_4e0);
    pFVar10 = Descriptor::FindFieldByName(message_descriptor,sVar14);
    if (pFVar10 == (FieldDescriptor *)0x0) break;
    std::__cxx11::string::append((char *)local_4e0);
  }
  pPVar1 = this->printer_;
  sVar14 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_4e0);
  io::Printer::Print<>(pPVar1,sVar14);
  bVar2 = false;
  field_des_3._0_4_ = 0;
  do {
    iVar5 = Descriptor::field_count(message_descriptor);
    if (iVar5 <= (int)field_des_3) {
      if (bVar2) {
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_708,", **kwargs");
        io::Printer::Print<>(pPVar1,local_708);
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_718,") -> None: ...\n");
      io::Printer::Print<>(pPVar1,local_718);
      io::Printer::Outdent(this->printer_);
      std::__cxx11::string::~string(local_4e0);
      std::__cxx11::string::~string((string *)local_60);
      return;
    }
    pFVar10 = Descriptor::field(message_descriptor,(int)field_des_3);
    sVar14 = FieldDescriptor::name(pFVar10);
    name_01._M_str = sVar14._M_str;
    field_name.field_2._8_8_ = sVar14._M_len;
    name_01._M_len = (size_t)name_01._M_str;
    bVar3 = IsPythonKeyword((python *)field_name.field_2._8_8_,name_01);
    if (bVar3) {
      bVar2 = true;
    }
    else {
      sVar14 = FieldDescriptor::name(pFVar10);
      local_558 = sVar14;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_548,&local_558,&local_559);
      std::allocator<char>::~allocator(&local_559);
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_570,", $field_name$: ");
      io::Printer::Print<char[11],std::__cxx11::string>
                (pPVar1,local_570,(char (*) [11])0xaa5115,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_590,"field_name",&local_591);
      Annotate<google::protobuf::FieldDescriptor>(this,&local_590,pFVar10);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator(&local_591);
      bVar3 = FieldDescriptor::is_repeated(pFVar10);
      if (bVar3) {
LAB_002714f0:
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&map_entry,"_Optional[");
        io::Printer::Print<>(pPVar1,_map_entry);
      }
      else {
        CVar6 = FieldDescriptor::cpp_type(pFVar10);
        if (CVar6 != CPPTYPE_BOOL) goto LAB_002714f0;
      }
      bVar3 = FieldDescriptor::is_map(pFVar10);
      if (bVar3) {
        local_5b0 = FieldDescriptor::message_type(pFVar10);
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_5c0,"_Mapping[$key_type$, $value_type$]");
        pFVar11 = Descriptor::field(local_5b0,0);
        GetFieldType_abi_cxx11_(&local_5e0,this,pFVar11,message_descriptor);
        pFVar11 = Descriptor::field(local_5b0,1);
        GetFieldType_abi_cxx11_(&local_600,this,pFVar11,message_descriptor);
        io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
                  (pPVar1,local_5c0,(char (*) [9])0xafb626,&local_5e0,(char (*) [11])0xafb71b,
                   &local_600);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_5e0);
      }
      else {
        bVar3 = FieldDescriptor::is_repeated(pFVar10);
        if (bVar3) {
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&extra_init_types,
                     "_Iterable[");
          io::Printer::Print<>(pPVar1,_extra_init_types);
        }
        CVar6 = FieldDescriptor::cpp_type(pFVar10);
        if (CVar6 == CPPTYPE_MESSAGE) {
          pDVar9 = FieldDescriptor::message_type(pFVar10);
          ExtraInitTypes_abi_cxx11_(&local_638,this,pDVar9);
          local_618 = &local_638;
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_648,"_Union[$extra_init_types$$type_name$, _Mapping]");
          args_1 = local_618;
          GetFieldType_abi_cxx11_(&local_668,this,pFVar10,message_descriptor);
          io::Printer::Print<char[17],std::__cxx11::string,char[10],std::__cxx11::string>
                    (pPVar1,local_648,(char (*) [17])"extra_init_types",args_1,
                     (char (*) [10])0xb94098,&local_668);
          std::__cxx11::string::~string((string *)&local_668);
          std::__cxx11::string::~string((string *)&local_638);
        }
        else {
          CVar6 = FieldDescriptor::cpp_type(pFVar10);
          if (CVar6 == CPPTYPE_ENUM) {
            pPVar1 = this->printer_;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_678,"_Union[$type_name$, str]");
            pEVar8 = FieldDescriptor::enum_type(pFVar10);
            ModuleLevelName<google::protobuf::EnumDescriptor>(&local_698,this,pEVar8);
            io::Printer::Print<char[10],std::__cxx11::string>
                      (pPVar1,local_678,(char (*) [10])0xb94098,&local_698);
            std::__cxx11::string::~string((string *)&local_698);
          }
          else {
            pPVar1 = this->printer_;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_6a8,"$type_name$");
            GetFieldType_abi_cxx11_(&local_6c8,this,pFVar10,message_descriptor);
            io::Printer::Print<char[10],std::__cxx11::string>
                      (pPVar1,local_6a8,(char (*) [10])0xb94098,&local_6c8);
            std::__cxx11::string::~string((string *)&local_6c8);
          }
        }
        bVar3 = FieldDescriptor::is_repeated(pFVar10);
        if (bVar3) {
          pPVar1 = this->printer_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6d8,"]");
          io::Printer::Print<>(pPVar1,local_6d8);
        }
      }
      bVar3 = FieldDescriptor::is_repeated(pFVar10);
      if (bVar3) {
LAB_00271ac1:
        pPVar1 = this->printer_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6e8,"]");
        io::Printer::Print<>(pPVar1,local_6e8);
      }
      else {
        CVar6 = FieldDescriptor::cpp_type(pFVar10);
        if (CVar6 != CPPTYPE_BOOL) goto LAB_00271ac1;
      }
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6f8," = ...");
      io::Printer::Print<>(pPVar1,local_6f8);
      std::__cxx11::string::~string((string *)local_548);
    }
    field_des_3._0_4_ = (int)field_des_3 + 1;
  } while( true );
}

Assistant:

void PyiGenerator::PrintMessage(const Descriptor& message_descriptor,
                                bool is_nested) const {
  if (!is_nested) {
    printer_->Print("\n");
  }
  const absl::string_view class_name = message_descriptor.name();
  std::string extra_base;
  // A well-known type needs to inherit from its corresponding base class in
  // net/proto2/python/internal/well_known_types.
  if (IsWellKnownType(message_descriptor.full_name())) {
    extra_base =
        absl::StrCat(", _well_known_types.", message_descriptor.name());
  } else {
    extra_base = "";
  }
  printer_->Print("class $class_name$(_message.Message$extra_base$):\n",
                  "class_name", class_name, "extra_base", extra_base);
  Annotate("class_name", &message_descriptor);
  printer_->Indent();

  // Prints slots
  printer_->Print("__slots__ = (");
  int items_printed = 0;
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor* field_des = message_descriptor.field(i);
    if (IsPythonKeyword(field_des->name())) {
      continue;
    }
    if (items_printed > 0) {
      printer_->Print(", ");
    }
    ++items_printed;
    printer_->Print("\"$field_name$\"", "field_name", field_des->name());
  }
  printer_->Print(items_printed == 1 ? ",)\n" : ")\n");

  // Prints Extensions for extendable messages
  if (message_descriptor.extension_range_count() > 0) {
    printer_->Print("Extensions: _python_message._ExtensionDict\n");
  }

  // Prints nested enums
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    PrintEnum(*message_descriptor.enum_type(i));
    PrintEnumValues(*message_descriptor.enum_type(i));
  }

  // Prints nested messages
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    PrintMessage(*message_descriptor.nested_type(i), true);
  }

  PrintExtensions(message_descriptor);

  // Prints field number
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor& field_des = *message_descriptor.field(i);
    printer_->Print(
        "$field_number_name$: _ClassVar[int]\n", "field_number_name",
        absl::StrCat(absl::AsciiStrToUpper(field_des.name()), "_FIELD_NUMBER"));
  }
  // Prints field name and type
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor& field_des = *message_descriptor.field(i);
    if (IsPythonKeyword(field_des.name())) {
      continue;
    }
    std::string field_type = "";
    if (field_des.is_map()) {
      const FieldDescriptor* key_des = field_des.message_type()->field(0);
      const FieldDescriptor* value_des = field_des.message_type()->field(1);
      field_type =
          absl::StrCat(value_des->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
                           ? "_containers.MessageMap["
                           : "_containers.ScalarMap[",
                       GetFieldType(*key_des, message_descriptor), ", ",
                       GetFieldType(*value_des, message_descriptor));
    } else {
      if (field_des.is_repeated()) {
        field_type = (field_des.cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
                          ? "_containers.RepeatedCompositeFieldContainer["
                          : "_containers.RepeatedScalarFieldContainer[");
      }
      field_type += GetFieldType(field_des, message_descriptor);
    }

    if (field_des.is_repeated()) {
      absl::StrAppend(&field_type, "]");
    }
    printer_->Print("$name$: $type$\n",
                    "name", field_des.name(), "type", field_type);
    Annotate("name", &field_des);
  }

  // Prints __init__
  printer_->Print("def __init__(");
  // If the message has a field named "self" (see b/144146793), it can still be
  // passed to the initializer, which takes those as **kwargs. To avoid name
  // collision, we rename the self parameter by appending underscores until it
  // no longer collides. The self-parameter is in fact positional-only, so the
  // name in the pyi doesn't matter with regard to what runtime usage is valid.
  std::string self_arg_name = "self";
  while (message_descriptor.FindFieldByName(self_arg_name) != nullptr) {
    self_arg_name.append("_");
  }
  printer_->Print(self_arg_name);
  bool has_python_keywords = false;
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor* field_des = message_descriptor.field(i);
    if (IsPythonKeyword(field_des->name())) {
      has_python_keywords = true;
      continue;
    }
    std::string field_name = std::string(field_des->name());
    printer_->Print(", $field_name$: ", "field_name", field_name);
    Annotate("field_name", field_des);
    if (field_des->is_repeated() ||
        field_des->cpp_type() != FieldDescriptor::CPPTYPE_BOOL) {
      printer_->Print("_Optional[");
    }
    if (field_des->is_map()) {
      const Descriptor* map_entry = field_des->message_type();
      printer_->Print(
          "_Mapping[$key_type$, $value_type$]", "key_type",
          GetFieldType(*map_entry->field(0), message_descriptor),
          "value_type",
          GetFieldType(*map_entry->field(1), message_descriptor));
    } else {
      if (field_des->is_repeated()) {
        printer_->Print("_Iterable[");
      }
      if (field_des->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        const auto& extra_init_types =
            ExtraInitTypes(*field_des->message_type());
        printer_->Print("_Union[$extra_init_types$$type_name$, _Mapping]",
                        "extra_init_types", extra_init_types, "type_name",
                        GetFieldType(*field_des, message_descriptor));
      } else {
        if (field_des->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
          printer_->Print("_Union[$type_name$, str]", "type_name",
                          ModuleLevelName(*field_des->enum_type()));
        } else {
          printer_->Print(
              "$type_name$", "type_name",
              GetFieldType(*field_des, message_descriptor));
        }
      }
      if (field_des->is_repeated()) {
        printer_->Print("]");
      }
    }
    if (field_des->is_repeated() ||
        field_des->cpp_type() != FieldDescriptor::CPPTYPE_BOOL) {
      printer_->Print("]");
    }
    printer_->Print(" = ...");
  }
  if (has_python_keywords) {
    printer_->Print(", **kwargs");
  }
  printer_->Print(") -> None: ...\n");
  printer_->Outdent();
}